

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

void write_word(char *w)

{
  char cVar1;
  int iVar2;
  int local_1c;
  int mismatched;
  int n;
  char *p;
  char *w_local;
  
  if (needspace != 0) {
    putc(0x20,(FILE *)fout);
  }
  needspace = 1;
  if ((w == (char *)0x0) || (_mismatched = w, *w == '\0')) {
    fprintf((FILE *)fout,"{}");
  }
  else {
    while (iVar2 = is_id(*_mismatched), iVar2 != 0) {
      _mismatched = _mismatched + 1;
    }
    if (*_mismatched == '\0') {
      fprintf((FILE *)fout,"%s",w);
    }
    else {
      local_1c = 0;
      for (_mismatched = w; *_mismatched != '\0'; _mismatched = _mismatched + 1) {
        if (*_mismatched == '{') {
          local_1c = local_1c + 1;
        }
        else if ((*_mismatched == '}') && (local_1c = local_1c + -1, local_1c < 0)) break;
      }
      putc(0x7b,(FILE *)fout);
      for (p = w; *p != '\0'; p = p + 1) {
        cVar1 = *p;
        if (((cVar1 == '#') || (cVar1 == '\\')) ||
           (((cVar1 == '{' || (cVar1 == '}')) && (local_1c != 0)))) {
          putc(0x5c,(FILE *)fout);
        }
        putc((int)*p,(FILE *)fout);
      }
      putc(0x7d,(FILE *)fout);
    }
  }
  return;
}

Assistant:

void write_word(const char *w) {
  if (needspace) putc(' ', fout);
  needspace = 1;
  if (!w || !*w) {fprintf(fout,"{}"); return;}
  const char *p;
  // see if it is a single word:
  for (p = w; is_id(*p); p++) ;
  if (!*p) {fprintf(fout,"%s",w); return;}
  // see if there are matching braces:
  int n = 0;
  for (p = w; *p; p++) {
    if (*p == '{') n++;
    else if (*p == '}') {n--; if (n<0) break;}
  }
  int mismatched = (n != 0);
  // write out brace-quoted string:
  putc('{', fout);
  for (; *w; w++) {
    switch (*w) {
    case '{':
    case '}':
      if (!mismatched) break;
    case '\\':
    case '#':
      putc('\\',fout);
      break;
    }
    putc(*w,fout);
  }
  putc('}', fout);
}